

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

ostream * despot::operator<<(ostream *os,HierarchyCPT *hcpt)

{
  NamedVar *pNVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Root variable: ",0xf);
  pNVar1 = *(hcpt->super_CPT).super_Function.parents_.
            super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(pNVar1->name_)._M_dataplus._M_p,(pNVar1->name_)._M_string_length);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((hcpt->cpts_).super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (hcpt->cpts_).super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      pNVar1 = *(hcpt->super_CPT).super_Function.parents_.
                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(pNVar1->name_)._M_dataplus._M_p,(pNVar1->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
      lVar2 = *(long *)&((*(hcpt->super_CPT).super_Function.parents_.
                           super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_Variable).values_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)(lVar2 + -8 + lVar4),*(long *)(lVar2 + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      operator<<(poVar3,(Function *)
                        (hcpt->cpts_).
                        super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5]);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < (ulong)((long)(hcpt->cpts_).
                                   super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(hcpt->cpts_).
                                   super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return os;
}

Assistant:

ostream& operator<<(std::ostream& os, const HierarchyCPT& hcpt) {
	os << "Root variable: " << hcpt.parents_[0]->name() << endl;
	for (int i = 0; i < hcpt.cpts_.size(); i++)
		os << hcpt.parents_[0]->name() << " = " << hcpt.parents_[0]->GetValue(i)
			<< " " << *(hcpt.cpts_[i]) << endl;
	return os;
}